

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

OrderCancelReplaceRequest * __thiscall
Application::queryCancelReplaceRequest43
          (OrderCancelReplaceRequest *__return_storage_ptr__,Application *this)

{
  string *psVar1;
  bool bVar2;
  Application *pAVar3;
  FieldBase *pFVar4;
  FieldBase *pFVar5;
  FieldBase local_230;
  FieldBase local_1d8;
  FieldBase local_180;
  FieldBase local_128;
  FieldBase local_d0;
  FieldBase local_78;
  
  pAVar3 = this;
  queryOrigClOrdID((OrigClOrdID *)&local_230,this);
  queryClOrdID((ClOrdID *)&local_d0,pAVar3);
  pAVar3 = (Application *)0x15;
  FIX::CharField::CharField((CharField *)&local_1d8,0x15,'1');
  local_1d8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00161ea0;
  querySide((Side *)&local_128,pAVar3);
  FIX::TransactTime::TransactTime((TransactTime *)&local_180);
  queryOrdType((OrdType *)&local_78,pAVar3);
  pFVar4 = &local_230;
  FIX43::OrderCancelReplaceRequest::OrderCancelReplaceRequest
            (__return_storage_ptr__,(OrigClOrdID *)pFVar4,(ClOrdID *)&local_d0,
             (HandlInst *)&local_1d8,(Side *)&local_128,(TransactTime *)&local_180,
             (OrdType *)&local_78);
  FIX::FieldBase::~FieldBase(&local_78);
  FIX::FieldBase::~FieldBase(&local_180);
  FIX::FieldBase::~FieldBase(&local_128);
  FIX::FieldBase::~FieldBase(&local_1d8);
  FIX::FieldBase::~FieldBase(&local_d0);
  FIX::FieldBase::~FieldBase(&local_230);
  querySymbol((Symbol *)&local_230,(Application *)pFVar4);
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&local_230,true);
  FIX::FieldBase::~FieldBase(&local_230);
  psVar1 = &local_230.m_string;
  pFVar4 = &local_230;
  local_230._vptr_FieldBase = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)pFVar4,"New price","");
  pFVar5 = &local_230;
  bVar2 = queryConfirm((Application *)pFVar4,(string *)pFVar5);
  if ((string *)local_230._vptr_FieldBase != psVar1) {
    pFVar5 = (FieldBase *)(local_230.m_string._M_dataplus._M_p + 1);
    operator_delete(local_230._vptr_FieldBase,(ulong)pFVar5);
  }
  if (bVar2) {
    queryPrice((Price *)&local_230,(Application *)pFVar5);
    FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&local_230,true);
    FIX::FieldBase::~FieldBase(&local_230);
  }
  pFVar4 = &local_230;
  local_230._vptr_FieldBase = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)pFVar4,"New quantity","");
  pFVar5 = &local_230;
  bVar2 = queryConfirm((Application *)pFVar4,(string *)pFVar5);
  if ((string *)local_230._vptr_FieldBase != psVar1) {
    pFVar5 = (FieldBase *)(local_230.m_string._M_dataplus._M_p + 1);
    operator_delete(local_230._vptr_FieldBase,(ulong)pFVar5);
  }
  if (bVar2) {
    queryOrderQty((OrderQty *)&local_230,(Application *)pFVar5);
    FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&local_230,true);
    FIX::FieldBase::~FieldBase(&local_230);
  }
  queryHeader(this,(Header *)&(__return_storage_ptr__->super_Message).field_0x70);
  return __return_storage_ptr__;
}

Assistant:

FIX43::OrderCancelReplaceRequest Application::queryCancelReplaceRequest43() {
  FIX43::OrderCancelReplaceRequest cancelReplaceRequest(
      queryOrigClOrdID(),
      queryClOrdID(),
      FIX::HandlInst('1'),
      querySide(),
      FIX::TransactTime(),
      queryOrdType());

  cancelReplaceRequest.set(querySymbol());
  if (queryConfirm("New price")) {
    cancelReplaceRequest.set(queryPrice());
  }
  if (queryConfirm("New quantity")) {
    cancelReplaceRequest.set(queryOrderQty());
  }

  queryHeader(cancelReplaceRequest.getHeader());
  return cancelReplaceRequest;
}